

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall
Sudoku::createFieldCopy
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *copiedFields)

{
  Field *pFVar1;
  element_type *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  shared_ptr<Field> *psVar7;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  shared_ptr<Field> *local_80;
  pointer local_78;
  shared_ptr<Field> new_field;
  _Rb_tree_node_base *local_58;
  __shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  for (psVar7 = (this->field_begin_)._M_current; psVar7 != (this->field_end_)._M_current;
      psVar7 = psVar7 + 1) {
    pFVar1 = (psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_84 = Field::id(pFVar1);
    local_88 = Field::pos_x(pFVar1);
    local_8c = Field::pos_y(pFVar1);
    local_90 = Field::pos_z(pFVar1);
    Field::max_value(pFVar1);
    std::make_shared<Field,int,int,int,int,int>
              ((int *)&new_field,&local_84,&local_88,&local_8c,&local_90);
    bVar2 = Field::fixed(pFVar1);
    this_00 = new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar2) {
      iVar3 = Field::value(pFVar1);
      Field::setValue(this_00,iVar3);
      Field::setFixed(new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
    }
    std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::push_back
              (copiedFields,&new_field);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  local_78 = (copiedFields->
             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->field_begin_)._M_current;
  do {
    if (local_80 == psVar7) {
      return;
    }
    pFVar1 = (local_78->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Field::dependencies((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                         *)&new_field,
                        (local_80->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    for (p_Var5 = local_58;
        p_Var5 != (_Rb_tree_node_base *)
                  &new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar3 = Field::id(*(Field **)(p_Var5 + 1));
      for (p_Var6 = &((copiedFields->
                      super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>;
          p_Var6 != &((copiedFields->
                      super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>; p_Var6 = p_Var6 + 1) {
        iVar4 = Field::id(p_Var6->_M_ptr);
        if (iVar4 == iVar3) {
          std::__shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var6);
          Field::addDependency(pFVar1,(shared_ptr<Field> *)&local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          break;
        }
      }
    }
    std::
    _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                 *)&new_field);
    local_80 = local_80 + 1;
    local_78 = local_78 + 1;
    psVar7 = (this->field_end_)._M_current;
  } while( true );
}

Assistant:

void Sudoku::createFieldCopy(std::vector<std::shared_ptr<Field>> &copiedFields)
{
  // create new copy of fields
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++)
  {
    Field &field = **iter;
    // create new field with same properties as field
    std::shared_ptr<Field> new_field = std::make_shared<Field>(field.id(), field.pos_x(), field.pos_y(), field.pos_z(),
      field.max_value());

    // copy fixed state
    if(field.fixed())
    {
      new_field->setValue(field.value());
      new_field->setFixed(true);
    }

    copiedFields.push_back(new_field);
  }

  // create copy of dependencies
  FieldVector::iterator iter_new = copiedFields.begin();
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++, iter_new++)
  {
    Field &field = **iter;
    Field &new_field = **iter_new;
    // loop over all dependencies
    for(auto &dependency: field.dependencies())
    {
      int id = dependency->id();

      // find field with that id in copiedFields
      for(FieldVector::iterator iter_copy = copiedFields.begin(); iter_copy != copiedFields.end(); iter_copy++)
      {
        if((*iter_copy)->id() == id)
        {
          new_field.addDependency((*iter_copy));
          break;
        }
      }
    }
  }
}